

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lists.cc
# Opt level: O3

void __thiscall Lists<int_*>::append(Lists<int_*> *this,int *item)

{
  element_type *peVar1;
  ListNodes<int_*> *__p;
  shared_ptr<ListNodes<int_*>_> node;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  undefined8 local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_48 = (element_type *)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->theSize = this->theSize + 1;
  __p = (ListNodes<int_*> *)operator_new(0x18);
  local_38 = 0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __p->theItem = item;
  (__p->theNext).super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->theNext).super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__p->theNext).super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&_Stack_30);
  std::__shared_ptr<ListNodes<int*>,(__gnu_cxx::_Lock_policy)2>::reset<ListNodes<int*>>
            ((__shared_ptr<ListNodes<int*>,(__gnu_cxx::_Lock_policy)2> *)&local_48,__p);
  if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  if ((this->theHead).super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    (this->theHead).super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_48;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->theHead).super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&_Stack_40);
  }
  else {
    peVar1 = (this->theLast).super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_28 = local_48;
    local_20._M_pi = _Stack_40._M_pi;
    if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Stack_40._M_pi)->_M_use_count = (_Stack_40._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Stack_40._M_pi)->_M_use_count = (_Stack_40._M_pi)->_M_use_count + 1;
      }
    }
    (peVar1->theNext).super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_48;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(peVar1->theNext).super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_20);
    if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
    }
  }
  (this->theLast).super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->theLast).super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&_Stack_40);
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
  }
  return;
}

Assistant:

void Lists<T>::append(T item) {
    shared_ptr<ListNodes<T>> node;

    theSize++;
    node.reset(new ListNodes<T>(item, 0));

    if (theHead == nullptr) {
        theHead = node;
        theLast = node;
    } else {
        theLast->set_next(node);
        theLast = node;
    }
}